

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::recalculateItemHeight(CGUIListBox *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  u32 uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int *piVar8;
  long in_RDI;
  s32 minItemHeight;
  IGUISkin *skin;
  IReferenceCounted *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_20 [2];
  undefined8 local_18;
  long *local_10;
  
  local_10 = (long *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))();
  lVar2 = *(long *)(in_RDI + 0x170);
  lVar6 = (**(code **)(*local_10 + 0x30))(local_10,0);
  if (lVar2 != lVar6) {
    if (*(long *)(in_RDI + 0x170) != 0) {
      IReferenceCounted::drop(in_stack_ffffffffffffffa8);
    }
    uVar7 = (**(code **)(*local_10 + 0x30))(local_10,0);
    *(undefined8 *)(in_RDI + 0x170) = uVar7;
    if (*(int *)(in_RDI + 0x160) == 0) {
      *(undefined4 *)(in_RDI + 0x15c) = 0;
    }
    if (*(long *)(in_RDI + 0x170) != 0) {
      if (*(int *)(in_RDI + 0x160) == 0) {
        uVar7 = (**(code **)(**(long **)(in_RDI + 0x170) + 8))(*(long **)(in_RDI + 0x170),L"A");
        local_18._4_4_ = (int)((ulong)uVar7 >> 0x20);
        *(int *)(in_RDI + 0x15c) = local_18._4_4_ + 4;
        local_18 = uVar7;
      }
      IReferenceCounted::grab
                ((IReferenceCounted *)
                 ((long)*(long **)(in_RDI + 0x170) + *(long *)(**(long **)(in_RDI + 0x170) + -0x18))
                );
    }
  }
  iVar1 = *(int *)(in_RDI + 0x15c);
  uVar4 = core::array<irr::gui::CGUIListBox::ListItem>::size
                    ((array<irr::gui::CGUIListBox::ListItem> *)0x3c0f76);
  *(u32 *)(in_RDI + 0x164) = iVar1 * uVar4;
  plVar3 = *(long **)(in_RDI + 0x180);
  local_20[1] = 0;
  iVar1 = *(int *)(in_RDI + 0x164);
  local_20[0] = core::rect<int>::getHeight((rect<int> *)(in_RDI + 0x40));
  local_20[0] = iVar1 - local_20[0];
  piVar8 = core::max_<int>(local_20 + 1,local_20);
  (**(code **)(*plVar3 + 0x120))(plVar3,*piVar8);
  if (*(int *)(in_RDI + 0x15c) < 1) {
    local_4c = 1;
  }
  else {
    local_4c = *(int *)(in_RDI + 0x15c);
  }
  (**(code **)(**(long **)(in_RDI + 0x180) + 0x148))(*(long **)(in_RDI + 0x180),local_4c);
  (**(code **)(**(long **)(in_RDI + 0x180) + 0x158))(*(long **)(in_RDI + 0x180),local_4c << 1);
  iVar1 = *(int *)(in_RDI + 0x164);
  iVar5 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 0x40));
  if (iVar5 < iVar1) {
    (**(code **)(**(long **)(in_RDI + 0x180) + 0x78))(*(long **)(in_RDI + 0x180),1);
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x180) + 0x78))(*(long **)(in_RDI + 0x180),0);
  }
  return;
}

Assistant:

void CGUIListBox::recalculateItemHeight()
{
	IGUISkin *skin = Environment->getSkin();

	if (Font != skin->getFont()) {
		if (Font)
			Font->drop();

		Font = skin->getFont();
		if (0 == ItemHeightOverride)
			ItemHeight = 0;

		if (Font) {
			if (0 == ItemHeightOverride)
				ItemHeight = Font->getDimension(L"A").Height + 4;

			Font->grab();
		}
	}

	TotalItemHeight = ItemHeight * Items.size();
	ScrollBar->setMax(core::max_(0, TotalItemHeight - AbsoluteRect.getHeight()));
	s32 minItemHeight = ItemHeight > 0 ? ItemHeight : 1;
	ScrollBar->setSmallStep(minItemHeight);
	ScrollBar->setLargeStep(2 * minItemHeight);

	if (TotalItemHeight <= AbsoluteRect.getHeight())
		ScrollBar->setVisible(false);
	else
		ScrollBar->setVisible(true);
}